

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp0_fast(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = (byte)iVar & 0x1f;
  iVar2 = 3 << bVar1;
  uVar4 = (ulong)(uint)nWords;
  iVar3 = nWords * 100 + 0x14;
  while( true ) {
    if ((int)uVar4 < 1) {
      *pDifStart = 0;
      return 0 << bVar1;
    }
    if (0x3f < iVar2) break;
    uVar6 = SFmask[iVar][0] & pInOut[uVar4 - 1];
    uVar5 = (pInOut[uVar4 - 1] & SFmask[iVar][3]) << ((byte)iVar2 & 0x3f);
    iVar3 = iVar3 + -100;
    uVar4 = uVar4 - 1;
    if (uVar6 != uVar5) {
      iVar2 = firstShiftWithOneBit(uVar5 ^ uVar6,1 << ((byte)iVar & 0x1f));
      *pDifStart = iVar3 - iVar2;
      return (uint)(uVar5 <= uVar6) * 3;
    }
  }
  __assert_fail("3*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0x89,"int minTemp0_fast(word *, int, int, int *)");
}

Assistant:

int minTemp0_fast(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( 3*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][0])) ^ ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][0])) < ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize)) )
                return 0;
            else
                return 3;
        }
    }
    *pDifStart=0;
    return 0;

}